

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_move.c
# Opt level: O0

void do_vanish(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  long lVar6;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var7;
  CHAR_DATA *unaff_retaddr;
  int nocrash;
  ROOM_INDEX_DATA *pRoomIndex;
  bool found;
  int chance;
  int in_stack_00000084;
  bool in_stack_0000008b;
  int in_stack_0000008c;
  CHAR_DATA *in_stack_00000090;
  int in_stack_000000ac;
  CHAR_DATA *in_stack_000000b0;
  char *in_stack_00005c00;
  CHAR_DATA *in_stack_00005c08;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  CHAR_DATA *in_stack_ffffffffffffffb0;
  CHAR_DATA *in_stack_ffffffffffffffb8;
  CHAR_DATA *in_stack_ffffffffffffffc0;
  CHAR_DATA *ch_00;
  CHAR_DATA *in_stack_ffffffffffffffe0;
  
  iVar3 = get_skill(in_stack_000000b0,in_stack_000000ac);
  if (iVar3 != 0) {
    iVar4 = (int)in_RDI->level;
    lVar6 = (long)gsn_vanish;
    this = char_data::Class(in_stack_ffffffffffffffc0);
    iVar5 = CClass::GetIndex(this);
    if (*(short *)(lVar6 * 0x60 + 0x8daef8 + (long)iVar5 * 2) <= iVar4) {
      bVar1 = is_affected(in_RDI,(int)gsn_vanish);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        return;
      }
      if (in_RDI->mana < 0x14) {
        send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        return;
      }
      WAIT_STATE(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
      iVar5 = number_percent();
      if ((double)iVar5 <= (double)iVar3 * 0.95) {
        ch_00 = (CHAR_DATA *)in_RDI->in_room->room_flags[0];
        _Var7 = std::pow<int,int>(0,0x56b5e8);
        if (((ulong)ch_00 & (long)_Var7) == 0) {
          in_stack_ffffffffffffffc0 = (CHAR_DATA *)in_RDI->in_room->room_flags[0];
          _Var7 = std::pow<int,int>(0,0x56b622);
          if (((ulong)in_stack_ffffffffffffffc0 & (long)_Var7) == 0) {
            in_RDI->mana = in_RDI->mana + -0x14;
            bVar1 = false;
            iVar3 = 0;
            do {
              if (99999 < iVar3) {
LAB_0056b7e2:
                if (!bVar1) {
                  in_RDI->mana = in_RDI->mana + 0x14;
                  send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                  return;
                }
                stop_fighting(in_stack_ffffffffffffffb0,
                              SUB41((uint)in_stack_ffffffffffffffac >> 0x18,0));
                act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb0,
                    (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
                send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
                char_from_room(unaff_retaddr);
                char_to_room(in_stack_ffffffffffffffe0,(ROOM_INDEX_DATA *)CONCAT44(iVar3,iVar4));
                act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                    in_stack_ffffffffffffffb0,
                    (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
                iVar3 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
                do_look(in_stack_00005c08,in_stack_00005c00);
                WAIT_STATE(in_stack_ffffffffffffffc0,iVar3);
                return;
              }
              number_range((int)in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
              in_stack_ffffffffffffffe0 =
                   (CHAR_DATA *)get_room_index((int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
              if ((in_stack_ffffffffffffffe0 != (CHAR_DATA *)0x0) &&
                 (in_stack_ffffffffffffffe0->pet == (CHAR_DATA *)in_RDI->in_room->area)) {
                in_stack_ffffffffffffffb8 = *(CHAR_DATA **)&in_stack_ffffffffffffffe0->lines;
                _Var7 = std::pow<int,int>(0,0x56b72c);
                if ((((ulong)in_stack_ffffffffffffffb8 & (long)_Var7) == 0) &&
                   (((short)in_stack_ffffffffffffffe0->hit == 0 &&
                    (bVar2 = can_see_room(ch_00,(ROOM_INDEX_DATA *)in_stack_ffffffffffffffc0), bVar2
                    )))) {
                  in_stack_ffffffffffffffb0 = *(CHAR_DATA **)&in_stack_ffffffffffffffe0->lines;
                  _Var7 = std::pow<int,int>(0,0x56b789);
                  if ((((ulong)in_stack_ffffffffffffffb0 & (long)_Var7) == 0) &&
                     ((in_RDI->in_room->vnum != 0x4bc && (in_stack_ffffffffffffffe0->trust != 0x4bc)
                      ))) {
                    bVar1 = true;
                    goto LAB_0056b7e2;
                  }
                }
              }
              iVar3 = iVar3 + 1;
            } while( true );
          }
        }
      }
      send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      act((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
          (void *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),0);
      check_improve(in_stack_00000090,in_stack_0000008c,in_stack_0000008b,in_stack_00000084);
      in_RDI->mana = in_RDI->mana + -10;
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void do_vanish(CHAR_DATA *ch, char *argument)
{
	auto chance = get_skill(ch, gsn_vanish);
	if (chance == 0 || ch->level < skill_table[gsn_vanish].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_vanish))
	{
		send_to_char("You cannot vanish again so soon.\n\r", ch);
		return;
	}

	if (ch->mana < 20)
	{
		send_to_char("You don't have the mana.", ch);
		return;
	}

	WAIT_STATE(ch, PULSE_VIOLENCE);

	if (number_percent() > (chance * .95)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_RECALL)
		|| IS_SET(ch->in_room->room_flags, ROOM_NO_SUMMON_FROM))
	{
		send_to_char("You attempt to vanish without trace but fail.\n\r", ch);
		act("$n attempts to slide into the shadows but fails.", ch, 0, 0, TO_ROOM);

		check_improve(ch, gsn_vanish, false, 2);

		ch->mana -= 10;

		return;
	}

	ch->mana -= 20;

	auto found = false;
	ROOM_INDEX_DATA *pRoomIndex;
	for (auto nocrash = 0; nocrash < 100000; nocrash++)
	{
		pRoomIndex = get_room_index(number_range(0, 30000));
		if (pRoomIndex == nullptr)
			continue;

		if (pRoomIndex->area == ch->in_room->area
			&& !IS_SET(pRoomIndex->room_flags, ROOM_PRIVATE)
			&& pRoomIndex->guild == 0
			&& can_see_room(ch, pRoomIndex)
			&& !IS_SET(pRoomIndex->room_flags, ROOM_SOLITARY)
			&& ch->in_room->vnum != 1212
			&& pRoomIndex->vnum != 1212)
		{
			found = true;
			break;
		}
	}

	if (!found)
	{
		ch->mana += 20;

		send_to_char("You failed.", ch);
		return;
	}

	stop_fighting(ch, true);

	act("$n suddenly vanishes into the shadows!", ch, 0, 0, TO_ROOM);
	send_to_char("You slip into the shadows and vanish!\n\r", ch);

	char_from_room(ch);
	char_to_room(ch, pRoomIndex);

	act("$n appears from the shadows.", ch, 0, 0, TO_ROOM);

	do_look(ch, "auto");

	WAIT_STATE(ch, PULSE_VIOLENCE * 2);
}